

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_search.hpp
# Opt level: O2

search_result * __thiscall
cvs_rk::local_search::run_fixed_n_all_neighbors
          (search_result *__return_storage_ptr__,local_search *this,
          vector<bool,_std::allocator<bool>_> *initial_solution)

{
  set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *this_00;
  iterator iVar1;
  ostream *poVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  ulint i;
  ulong uVar6;
  ulong __n;
  bool bVar7;
  pointer pmVar8;
  double dVar9;
  double dVar10;
  reference rVar11;
  double local_258;
  double local_250;
  double local_240;
  candidate_t C;
  _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_1d0;
  _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_1b8;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  hashed_vec;
  set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  distinct_rows;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  sum;
  _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_130;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  new_vec;
  candidate_t best_C;
  vector<bool,_std::allocator<bool>_> B;
  mod_int<9223372036854775783UL> c;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,initial_solution);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  matrix<cvs_rk::rk_function<9223372036854775783UL>_>::hashed_rows(&hashed_vec,&this->M);
  lVar5 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->M).columns.
                             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->M).columns.
                            super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar6 = uVar6 + 1) {
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](initial_solution,uVar6);
    if ((*rVar11._M_p & rVar11._M_mask) == 0) {
      operator-((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                 *)&C,&hashed_vec,
                (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                 *)((long)&(((this->M).columns.
                             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                           )._M_impl.super__Vector_impl_data + lVar5));
      std::
      vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ::_M_move_assign(&hashed_vec,&C);
      std::
      _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ::~_Vector_base((_Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                       *)&C);
    }
    lVar5 = lVar5 + 0x18;
  }
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
            (&C,initial_solution,&hashed_vec);
  this_00 = &this->explored;
  std::
  _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  ::_M_insert_unique<std::vector<bool,std::allocator<bool>>const&>
            ((_Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
              *)this_00,&C.first);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            *)&local_1b8,&C.second);
  local_250 = HK<cvs_rk::mod_int<9223372036854775783ul>>
                        ((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                          *)&local_1b8);
  std::
  _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~_Vector_base(&local_1b8);
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::pair(&best_C,&C);
  bVar7 = false;
  local_240 = local_250;
  while( true ) {
    dVar10 = local_250;
    if (bVar7) break;
    pvVar3 = (this->M).columns.
             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this->M).columns.
             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (uVar6 = 0; uVar6 < (ulong)(((long)pvVar4 - (long)pvVar3) / 0x18); uVar6 = uVar6 + 1) {
      lVar5 = 0;
      for (__n = 0; __n < (ulong)(((long)pvVar4 - (long)pvVar3) / 0x18); __n = __n + 1) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&C.first,uVar6);
        if ((*rVar11._M_p & rVar11._M_mask) == 0) {
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&C.first,__n);
          if ((*rVar11._M_p & rVar11._M_mask) != 0) {
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)
                       &B.super__Bvector_base<std::allocator<bool>_>,&C.first);
            distinct_rows._M_t._M_impl._0_8_ = 0;
            distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            distinct_rows._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &B.super__Bvector_base<std::allocator<bool>_>,uVar6);
            *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                &B.super__Bvector_base<std::allocator<bool>_>,__n);
            *rVar11._M_p = *rVar11._M_p & ~rVar11._M_mask;
            iVar1 = std::
                    _Rb_tree<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_std::_Identity<std::vector<bool,_std::allocator<bool>_>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ::find(&this_00->_M_t,(key_type *)&B.super__Bvector_base<std::allocator<bool>_>)
            ;
            if ((_Rb_tree_header *)iVar1._M_node ==
                &(this->explored)._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
              ::_M_insert_unique<std::vector<bool,std::allocator<bool>>const&>
                        ((_Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                          *)this_00,
                         (vector<bool,_std::allocator<bool>_> *)
                         &B.super__Bvector_base<std::allocator<bool>_>);
              operator+(&sum,&C.second,
                        (this->M).columns.
                        super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar6);
              operator-((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                         *)&new_vec.
                            super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        ,&sum,(vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                               *)((long)&(((this->M).columns.
                                           super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                         )._M_impl.super__Vector_impl_data + lVar5));
              std::
              pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              ::
              pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
                        ((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                          *)&c,(vector<bool,_std::allocator<bool>_> *)
                               &B.super__Bvector_base<std::allocator<bool>_>,
                         (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                          *)&new_vec.
                             super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        );
              std::
              pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              ::operator=((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                           *)&distinct_rows,
                          (pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                           *)&c);
              std::
              pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              ::~pair((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                       *)&c);
              std::
              vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        *)&local_130,
                       (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        *)&distinct_rows._M_t._M_impl.super__Rb_tree_header._M_node_count);
              dVar9 = HK<cvs_rk::mod_int<9223372036854775783ul>>
                                ((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                  *)&local_130);
              std::
              _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              ::~_Vector_base(&local_130);
              if (local_240 <= dVar9) {
                std::
                pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                ::operator=(&best_C,(pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                                     *)&distinct_rows);
                local_240 = dVar9;
              }
              std::
              _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              ::~_Vector_base(&new_vec.
                               super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                             );
              std::
              _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              ::~_Vector_base(&sum.
                               super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                             );
            }
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
            ::~pair((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                     *)&distinct_rows);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      (&B.super__Bvector_base<std::allocator<bool>_>);
          }
        }
        lVar5 = lVar5 + 0x18;
        pvVar3 = (this->M).columns.
                 super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->M).columns.
                 super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    local_258 = local_250;
    bVar7 = local_240 <= local_250;
    if (local_250 < local_240) {
      std::
      pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
      ::operator=(&C,&best_C);
      local_258 = local_240;
    }
    std::operator<<((ostream *)&std::cout,"Current best solution: H(K) = ");
    poVar2 = std::ostream::_M_insert<double>(local_258);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_250 = local_258;
    if (local_240 <= dVar10) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Local maximum reached. Search terminated.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header;
  distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  distinct_rows._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       distinct_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pmVar8 = C.second.
                super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar8 != C.second.
                super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pmVar8 = pmVar8 + 1) {
    c.val = pmVar8->val;
    std::
    _Rb_tree<cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>,std::_Identity<cvs_rk::mod_int<9223372036854775783ul>>,cvs_rk::local_search::run_fixed_n_all_neighbors(std::vector<bool,std::allocator<bool>>)::{lambda(cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>)#1},std::allocator<cvs_rk::mod_int<9223372036854775783ul>>>
    ::_M_insert_unique<cvs_rk::mod_int<9223372036854775783ul>const&>
              ((_Rb_tree<cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>,std::_Identity<cvs_rk::mod_int<9223372036854775783ul>>,cvs_rk::local_search::run_fixed_n_all_neighbors(std::vector<bool,std::allocator<bool>>)::_lambda(cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>)_1_,std::allocator<cvs_rk::mod_int<9223372036854775783ul>>>
                *)&distinct_rows,&c);
  }
  std::vector<bool,_std::allocator<bool>_>::vector(&__return_storage_ptr__->B,&C.first);
  __return_storage_ptr__->HK = local_250;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            *)&local_1d0,&C.second);
  dVar10 = H<cvs_rk::mod_int<9223372036854775783ul>>
                     ((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                       *)&local_1d0);
  __return_storage_ptr__->H = dVar10;
  __return_storage_ptr__->distinct_rows =
       (int)distinct_rows._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~_Vector_base(&local_1d0);
  std::
  _Rb_tree<cvs_rk::mod_int<9223372036854775783UL>,_cvs_rk::mod_int<9223372036854775783UL>,_std::_Identity<cvs_rk::mod_int<9223372036854775783UL>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~_Rb_tree(&distinct_rows._M_t);
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::~pair(&best_C);
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::~pair(&C);
  std::
  _Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~_Vector_base(&hashed_vec.
                   super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

search_result run_fixed_n_all_neighbors(vector<bool> initial_solution){

		int N = weight(initial_solution);

		auto hashed_vec = M.hashed_rows();

		for(ulint i=0;i<M.n_columns();++i){

			//remove column from hashed vector
			if(not initial_solution[i]){

				hashed_vec = hashed_vec - M.column(i);

			}

		}

		candidate_t C = {

				initial_solution,
				hashed_vec

		};

		explored.insert(C.first);

		//best H(K): entropy of current solution
		double best_HK = HK<matrix_t::mod_int_t>(C.second);
		double C_HK = best_HK;

		candidate_t best_C = C;

		bool local_max = false;

		//proceed until a local maximum is reached
		while(not local_max){

			//init as true, then check all neighbors
			//if at least 1 neighbor improves the score
			//of C, then local_max = false
			local_max = true;

			//try all neighbors
			//the set of neighbors is built trying all possible O(L^2) combinations
			//of both a flip 0->1 and a flip 1->0
			for(ulint j0 = 0;j0<M.n_columns();++j0){//0->1

				for(ulint j1 = 0;j1<M.n_columns();++j1){//1->0

					if(not C.first[j0] and C.first[j1]){

						auto B = C.first;
						candidate_t new_C;		//neighbor

						B[j0] = true;
						B[j1] = false;

						assert(N==weight(B));

						if(explored.find(B) == explored.end()){

							explored.insert(B);

							auto sum = C.second + M.column(j0);	//sum j0-th column
							auto new_vec = sum-M.column(j1);	//subtract j1-th column

							//new candidate
							new_C = {
									B,
									new_vec
							};

							//compute counts entropy
							double new_HK = HK<matrix_t::mod_int_t>(new_C.second);

							//cout << new_HK << endl;

							if(new_HK>=best_HK){

								best_HK = new_HK;
								best_C = new_C;

							}

						}

					}

				}

			}//end neighbor search cycle

			//if at least 1 neighbor strictly improves
			//C's entropy, then C is not a local maximum
			local_max = best_HK <= C_HK;

			if(not local_max){
				C  = best_C;
				C_HK = best_HK;
			}

			cout << "Current best solution: H(K) = " << C_HK << endl;

			if(local_max){

				cout << "Local maximum reached. Search terminated." << endl;

			}

		}

		auto comp = [](matrix_t::mod_int_t x, matrix_t::mod_int_t y){ return x < y; };
		std::set<matrix_t::mod_int_t,decltype(comp)> distinct_rows(comp);

		for(auto c:C.second) distinct_rows.insert(c);

		return {C.first, C_HK, H<matrix_t::mod_int_t>(C.second), int(distinct_rows.size())};

	}